

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unfounded_check.cpp
# Opt level: O2

int __thiscall Clasp::DefaultUnfoundedCheck::init(DefaultUnfoundedCheck *this,EVP_PKEY_CTX *ctx)

{
  size_type sVar1;
  uint uVar2;
  LitVec *pLVar3;
  pointer pAVar4;
  pointer pBVar5;
  bool bVar6;
  byte bVar7;
  UfsType UVar8;
  MinimalityCheck *this_00;
  SolveParams *pSVar9;
  uint uVar10;
  uint data;
  ReasonStrategy rs;
  size_type i;
  long lVar11;
  pointer pAVar12;
  byte bVar13;
  Literal local_48;
  uint local_44;
  BodyPtr local_40;
  
  pLVar3 = this->reasons_;
  if (pLVar3 != (LitVec *)0x0) {
    lVar11._0_4_ = pLVar3[-1].ebo_.size;
    lVar11._4_4_ = pLVar3[-1].ebo_.cap;
    if (lVar11 != 0) {
      lVar11 = lVar11 << 4;
      do {
        bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::ebo::~ebo
                  ((ebo *)((long)&pLVar3[-1].ebo_.buf + lVar11));
        lVar11 = lVar11 + -0x10;
      } while (lVar11 != 0);
    }
    operator_delete__(&pLVar3[-1].ebo_.size);
  }
  this->reasons_ = (LitVec *)0x0;
  this->solver_ = (Solver *)ctx;
  if ((*(ulong *)(ctx + 0x70) >> 0x33 & 1) == 0) {
    rs = this->strategy_;
  }
  else {
    rs = no_reason;
  }
  setReasonStrategy(this,rs);
  while (UVar8 = findUfs(this,(Solver *)ctx,false), UVar8 != ufs_none) {
    while (uVar10 = (this->ufs_).qFront, uVar10 != (this->ufs_).vec.ebo_.size) {
      local_48.rep_ =
           (this->graph_->atoms_).ebo_.buf[(this->ufs_).vec.ebo_.buf[uVar10]].super_Node.lit.rep_ &
           0xfffffffe ^ 2;
      local_40.node = (BodyNode *)0x0;
      bVar6 = Solver::force((Solver *)ctx,&local_48,(Antecedent *)&local_40);
      if (!bVar6) {
        return 0;
      }
      uVar10 = (this->ufs_).qFront;
      (this->ufs_).qFront = uVar10 + 1;
      pAVar4 = (this->atoms_).ebo_.buf + (this->ufs_).vec.ebo_.buf[uVar10];
      *pAVar4 = (AtomData)((uint)*pAVar4 & 0xbfffffff);
    }
  }
  local_44 = (this->atoms_).ebo_.size;
  local_40.node = (BodyNode *)CONCAT44(local_40.node._4_4_,0x1fffffff);
  bk_lib::
  pod_vector<Clasp::DefaultUnfoundedCheck::AtomData,_std::allocator<Clasp::DefaultUnfoundedCheck::AtomData>_>
  ::resize(&this->atoms_,(this->graph_->atoms_).ebo_.size,(AtomData *)&local_40);
  pAVar4 = (this->atoms_).ebo_.buf;
  *pAVar4 = (AtomData)((uint)*pAVar4 | 0xe0000000);
  for (uVar10 = (this->bodies_).ebo_.size; uVar10 != (this->graph_->bodies_).ebo_.size;
      uVar10 = uVar10 + 1) {
    local_40.node = (BodyNode *)((ulong)local_40.node & 0xffffffff00000000);
    bk_lib::
    pod_vector<Clasp::DefaultUnfoundedCheck::BodyData,_std::allocator<Clasp::DefaultUnfoundedCheck::BodyData>_>
    ::push_back(&this->bodies_,(BodyData *)&local_40);
    pBVar5 = (this->graph_->bodies_).ebo_.buf;
    local_40.node = pBVar5 + uVar10;
    local_40.id = uVar10;
    if ((pBVar5[uVar10].super_Node.field_0x7 & 0x10) == 0) {
      initBody(this,&local_40);
    }
    else {
      initExtBody(this,&local_40);
    }
    addWatch(this,(Literal)(((local_40.node)->super_Node).lit.rep_ & 0xfffffffe ^ 2),local_40.id,
             watch_source_false);
  }
  propagateSource(this);
  uVar10 = (this->atoms_).ebo_.size;
  data = local_44;
  do {
    if (uVar10 == data) {
      if ((this->graph_->components_).ebo_.size != 0) {
        this_00 = (MinimalityCheck *)operator_new(0x18);
        pSVar9 = Solver::searchConfig((Solver *)ctx);
        MinimalityCheck::MinimalityCheck(this_00,&pSVar9->fwdCheck);
        SingleOwnerPtr<Clasp::DefaultUnfoundedCheck::MinimalityCheck,_Clasp::DeleteObject>::reset
                  (&this->mini_,this_00);
        bVar7 = *(byte *)(((this->mini_).ptr_ & 0xfffffffffffffffe) + 4);
        bVar13 = bVar7 & 3;
        if ((bVar7 & 3) != 0) {
          sVar1 = (this->atoms_).ebo_.size;
          for (uVar10 = local_44; sVar1 != uVar10; uVar10 = uVar10 + 1) {
            pAVar12 = (this->graph_->atoms_).ebo_.buf;
            if ((pAVar12[uVar10].super_Node.field_0x7 & 0x20) != 0) {
              uVar2 = pAVar12[uVar10].super_Node.lit.rep_;
              if ((*(byte *)((long)(this->solver_->assign_).assign_.ebo_.buf +
                            (ulong)(uVar2 & 0xfffffffc)) & 3) == 0) {
                bVar7 = ((uVar2 & 2) == 0) + 1;
                if ((bVar13 == 1) || ((bVar13 == 3 && ((uVar10 & 1) != 0)))) {
                  bVar7 = bVar7 ^ 3;
                }
                Solver::setPref(this->solver_,uVar2 >> 2,def_value,bVar7);
              }
            }
          }
        }
      }
      return (int)CONCAT71((uint7)(uint3)(data >> 8),1);
    }
    pAVar12 = (this->graph_->atoms_).ebo_.buf + data;
    if (-1 < (int)(this->atoms_).ebo_.buf[data]) {
      local_48.rep_ = (pAVar12->super_Node).lit.rep_ & 0xfffffffe ^ 2;
      local_40.node = (pointer)0x0;
      bVar6 = Solver::force(this->solver_,&local_48,(Antecedent *)&local_40);
      if (!bVar6) {
        return 0;
      }
    }
    if (((pAVar12->super_Node).field_0x7 & 0x10) != 0) {
      addWatch(this,(Literal)((pAVar12->super_Node).lit.rep_ & 0xfffffffe ^ 2),data,watch_head_false
              );
    }
    data = data + 1;
  } while( true );
}

Assistant:

bool DefaultUnfoundedCheck::init(Solver& s) {
	assert(!solver_ || solver_ == &s);
	delete[] reasons_;
	reasons_ = 0;
	solver_  = &s;
	setReasonStrategy(s.searchMode() != SolverStrategies::no_learning ? strategy_ : no_reason);
	// process any leftovers from previous steps
	while (findUfs(s, false) != ufs_none) {
		while (!ufs_.empty()) {
			if (!s.force(~graph_->getAtom(ufs_.front()).lit, 0)) { return false; }
			atoms_[ufs_.pop_ret()].ufs = 0;
		}
	}
	AtomVec::size_type startAtom = atoms_.size();
	// set up new atoms
	atoms_.resize(graph_->numAtoms());
	AtomData& sentinel = atoms_[DependencyGraph::sentinel_atom];
	sentinel.resurrectSource();
	sentinel.todo = 1;
	sentinel.ufs  = 1;
	// set up new bodies
	for (uint32 i = (uint32)bodies_.size(); i != graph_->numBodies(); ++i) {
		bodies_.push_back(BodyData());
		BodyPtr n(getBody(i));
		if (!n.node->extended()) {
			initBody(n);
		}
		else {
			initExtBody(n);
		}
		// when a body becomes false, it can no longer be used as source
		addWatch(~n.node->lit, n.id, watch_source_false);
	}
	// check for initially unfounded atoms
	propagateSource();
	for (AtomVec::size_type i = startAtom, end = atoms_.size(); i != end; ++i) {
		const AtomNode& a = graph_->getAtom(NodeId(i));
		if (!atoms_[i].hasSource() && !solver_->force(~a.lit, 0)) {
			return false;
		}
		if (a.inChoice()) {
			addWatch(~a.lit, NodeId(i), watch_head_false);
		}
	}
	if (graph_->numNonHcfs() != 0) {
		mini_ = new MinimalityCheck(s.searchConfig().fwdCheck);
		if (const uint32 sd = mini_->fwd.signDef) {
			for (AtomVec::size_type i = startAtom, end = atoms_.size(); i != end; ++i) {
				const AtomNode& a = graph_->getAtom(NodeId(i));
				if (a.inDisjunctive() && solver_->value(a.lit.var()) == value_free) {
					ValueRep v = falseValue(a.lit);
					if (sd == SolverStrategies::sign_pos || (sd == SolverStrategies::sign_rnd && (i & 1) != 0)) {
						v ^= static_cast<ValueRep>(3u);
					}
					solver_->setPref(a.lit.var(), ValueSet::def_value, v);
				}
			}
		}
	}
	return true;
}